

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void rtreeCheckCellCoord(RtreeCheck *pCheck,i64 iNode,int iCell,u8 *pCell,u8 *pParent)

{
  uint local_44;
  RtreeCoord local_40;
  int i;
  RtreeCoord p2;
  RtreeCoord p1;
  RtreeCoord c2;
  RtreeCoord c1;
  u8 *pParent_local;
  u8 *pCell_local;
  i64 iStack_18;
  int iCell_local;
  i64 iNode_local;
  RtreeCheck *pCheck_local;
  
  local_44 = 0;
  _c2 = pParent;
  pParent_local = pCell;
  pCell_local._4_4_ = iCell;
  iStack_18 = iNode;
  iNode_local = (i64)pCheck;
  do {
    if (*(int *)(iNode_local + 0x1c) <= (int)local_44) {
      return;
    }
    readCoord(pParent_local + (int)(local_44 << 3),&p1);
    readCoord(pParent_local + (int)((local_44 * 2 + 1) * 4),&p2);
    if (*(int *)(iNode_local + 0x18) == 0) {
      if (p2.f < p1.f) goto LAB_00230226;
    }
    else if (p2.i < p1.i) {
LAB_00230226:
      rtreeCheckAppendMsg((RtreeCheck *)iNode_local,
                          "Dimension %d of cell %d on node %lld is corrupt",(ulong)local_44,
                          (ulong)pCell_local._4_4_,iStack_18);
    }
    if (_c2 == (u8 *)0x0) goto LAB_002302e2;
    readCoord(_c2 + (int)(local_44 << 3),(RtreeCoord *)&i);
    readCoord(_c2 + (int)((local_44 * 2 + 1) * 4),&local_40);
    if (*(int *)(iNode_local + 0x18) == 0) {
      if ((float)i <= p1.f) goto LAB_002302a5;
LAB_002302c4:
      rtreeCheckAppendMsg((RtreeCheck *)iNode_local,
                          "Dimension %d of cell %d on node %lld is corrupt relative to parent",
                          (ulong)local_44,(ulong)pCell_local._4_4_,iStack_18);
    }
    else {
      if (p1.i < i) goto LAB_002302c4;
LAB_002302a5:
      if (*(int *)(iNode_local + 0x18) == 0) {
        if (local_40.f < p2.f) goto LAB_002302c4;
      }
      else if (local_40.i < p2.i) goto LAB_002302c4;
    }
LAB_002302e2:
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

static void rtreeCheckCellCoord(
  RtreeCheck *pCheck, 
  i64 iNode,                      /* Node id to use in error messages */
  int iCell,                      /* Cell number to use in error messages */
  u8 *pCell,                      /* Pointer to cell coordinates */
  u8 *pParent                     /* Pointer to parent coordinates */
){
  RtreeCoord c1, c2;
  RtreeCoord p1, p2;
  int i;

  for(i=0; i<pCheck->nDim; i++){
    readCoord(&pCell[4*2*i], &c1);
    readCoord(&pCell[4*(2*i + 1)], &c2);

    /* printf("%e, %e\n", c1.u.f, c2.u.f); */
    if( pCheck->bInt ? c1.i>c2.i : c1.f>c2.f ){
      rtreeCheckAppendMsg(pCheck, 
          "Dimension %d of cell %d on node %lld is corrupt", i, iCell, iNode
      );
    }

    if( pParent ){
      readCoord(&pParent[4*2*i], &p1);
      readCoord(&pParent[4*(2*i + 1)], &p2);

      if( (pCheck->bInt ? c1.i<p1.i : c1.f<p1.f) 
       || (pCheck->bInt ? c2.i>p2.i : c2.f>p2.f)
      ){
        rtreeCheckAppendMsg(pCheck, 
            "Dimension %d of cell %d on node %lld is corrupt relative to parent"
            , i, iCell, iNode
        );
      }
    }
  }
}